

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestInt value)

{
  char *pcVar1;
  LargestUInt value_00;
  UIntToStringBuffer buffer;
  allocator<char> local_41;
  char *local_40;
  char local_38 [25];
  char local_1f [15];
  
  local_40 = local_1f;
  if (this == (Json *)0x8000000000000000) {
    value_00 = 0x8000000000000000;
  }
  else {
    if (-1 < (long)this) {
      uintToString((LargestUInt)this,&local_40);
      pcVar1 = local_40;
      goto LAB_003f99cb;
    }
    value_00 = -(long)this;
  }
  uintToString(value_00,&local_40);
  pcVar1 = local_40;
  local_40[-1] = '-';
  pcVar1 = pcVar1 + -1;
LAB_003f99cb:
  if (local_38 <= pcVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,&local_41);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0x94,"std::string Json::valueToString(LargestInt)");
}

Assistant:

JSONCPP_STRING valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  if (value == Value::minLargestInt) {
    uintToString(LargestUInt(Value::maxLargestInt) + 1, current);
    *--current = '-';
  } else if (value < 0) {
    uintToString(LargestUInt(-value), current);
    *--current = '-';
  } else {
    uintToString(LargestUInt(value), current);
  }
  assert(current >= buffer);
  return current;
}